

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  char *expr;
  int iVar2;
  lys_module *plVar3;
  bool bVar4;
  ly_ctx *ctx;
  lyxp_set set;
  lys_restr *must;
  lys_node *schema;
  uint8_t must_size;
  uint8_t i;
  int ignore_fail_local;
  int inout_parent_local;
  lyd_node *node_local;
  
  ctx_00 = node->schema->module->ctx;
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x184c,"int resolve_must(struct lyd_node *, int, int)");
  }
  memset(&ctx,0,0x40);
  if (inout_parent == 0) {
    LVar1 = node->schema->nodetype;
    _ignore_fail_local = node;
    if (LVar1 == LYS_CONTAINER) {
      schema._6_1_ = node->schema->padding[1];
      set._56_8_ = node->schema[1].dsc;
    }
    else if (LVar1 == LYS_LEAF) {
      schema._6_1_ = node->schema->padding[3];
      set._56_8_ = node->schema[1].dsc;
    }
    else if (LVar1 == LYS_LEAFLIST) {
      schema._6_1_ = node->schema->padding[3];
      set._56_8_ = node->schema[1].dsc;
    }
    else if (LVar1 == LYS_LIST) {
      schema._6_1_ = node->schema->padding[0];
      set._56_8_ = node->schema[1].dsc;
    }
    else {
      if (LVar1 != LYS_ANYXML) {
        if (LVar1 == LYS_NOTIF) {
          schema._6_1_ = node->schema->padding[1];
          set._56_8_ = node->schema[1].dsc;
          goto LAB_00120df3;
        }
        if (LVar1 != LYS_ANYDATA) {
          schema._6_1_ = 0;
          goto LAB_00120df3;
        }
      }
      schema._6_1_ = node->schema->padding[3];
      set._56_8_ = node->schema[1].dsc;
    }
  }
  else {
    must = (lys_restr *)lys_parent(node->schema);
    while( true ) {
      bVar4 = false;
      if (must != (lys_restr *)0x0) {
        bVar4 = ((ulong)must[1].expr & 0x1042) != 0;
      }
      if (!bVar4) break;
      must = (lys_restr *)lys_parent((lys_node *)must);
    }
    if ((must == (lys_restr *)0x0) || (((ulong)must[1].expr & 0x600) == 0)) {
      ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
             ,0x1854);
      return -1;
    }
    schema._6_1_ = *(byte *)((long)&must->eapptag + 5);
    set._56_8_ = must[2].expr;
    _ignore_fail_local = node->parent;
    if ((_ignore_fail_local->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
      ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
             ,0x185d);
      return -1;
    }
  }
LAB_00120df3:
  schema._7_1_ = 0;
  while( true ) {
    if (schema._6_1_ <= schema._7_1_) {
      return 0;
    }
    expr = *(char **)(set._56_8_ + (ulong)schema._7_1_ * 0x38);
    plVar3 = lyd_node_module(_ignore_fail_local);
    iVar2 = lyxp_eval(expr,_ignore_fail_local,LYXP_NODE_ELEM,plVar3,(lyxp_set *)&ctx,1);
    if (iVar2 != 0) break;
    plVar3 = lyd_node_module(_ignore_fail_local);
    lyxp_set_cast((lyxp_set *)&ctx,LYXP_SET_BOOLEAN,_ignore_fail_local,plVar3,1);
    if (set._8_4_ == 0) {
      if ((ignore_fail != 1) &&
         (((*(ushort *)(set._56_8_ + (ulong)schema._7_1_ * 0x38 + 0x32) & 0x600) == 0 ||
          (ignore_fail != 2)))) {
        ly_vlog(ctx_00,LYE_NOMUST,LY_VLOG_LYD,_ignore_fail_local,
                *(undefined8 *)(set._56_8_ + (ulong)schema._7_1_ * 0x38));
        if (*(long *)(set._56_8_ + (ulong)schema._7_1_ * 0x38 + 0x20) != 0) {
          ly_vlog_str(ctx_00,LY_VLOG_PREV,*(char **)(set._56_8_ + (ulong)schema._7_1_ * 0x38 + 0x20)
                     );
        }
        if (*(long *)(set._56_8_ + (ulong)schema._7_1_ * 0x38 + 0x18) != 0) {
          ly_err_last_set_apptag(ctx_00,*(char **)(set._56_8_ + (ulong)schema._7_1_ * 0x38 + 0x18));
        }
        return 1;
      }
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "Must condition \"%s\" not satisfied, but it is not required.",
             *(undefined8 *)(set._56_8_ + (ulong)schema._7_1_ * 0x38));
    }
    schema._7_1_ = schema._7_1_ + 1;
  }
  return -1;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;
    struct ly_ctx *ctx = node->schema->module->ctx;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT(ctx);
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT(ctx);
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((must[i].flags & (LYS_XPCONF_DEP | LYS_XPSTATE_DEP)) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(ctx, LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    ly_vlog_str(ctx, LY_VLOG_PREV, must[i].emsg);
                }
                if (must[i].eapptag) {
                    ly_err_last_set_apptag(ctx, must[i].eapptag);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}